

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.hpp
# Opt level: O0

vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> *
Optimizer::generateSubstitutions
          (vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
           *__return_storage_ptr__,ScheduleHandle *schedule)

{
  bool bVar1;
  element_type *peVar2;
  Occupy *occupy_00;
  undefined1 local_60 [8];
  ScheduleHandle new_schedule;
  Occupy *occupy;
  iterator __end1;
  iterator __begin1;
  vector<Occupy,_std::allocator<Occupy>_> *__range1;
  ScheduleHandle *schedule_local;
  vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> *substitutions;
  
  peVar2 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      schedule);
  Schedule::analyze(peVar2);
  std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>::vector
            (__return_storage_ptr__);
  peVar2 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      schedule);
  __end1 = std::vector<Occupy,_std::allocator<Occupy>_>::begin(&peVar2->occupies);
  occupy = (Occupy *)std::vector<Occupy,_std::allocator<Occupy>_>::end(&peVar2->occupies);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Occupy_*,_std::vector<Occupy,_std::allocator<Occupy>_>_>
                                     *)&occupy), bVar1) {
    new_schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::__normal_iterator<Occupy_*,_std::vector<Occupy,_std::allocator<Occupy>_>_>::
         operator*(&__end1);
    occupy_00 = (Occupy *)
                std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)schedule);
    Schedule::apply((Schedule *)local_60,occupy_00);
    std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>::push_back
              (__return_storage_ptr__,(value_type *)local_60);
    peVar2 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_60);
    Schedule::analyze(peVar2);
    std::shared_ptr<Schedule>::~shared_ptr((shared_ptr<Schedule> *)local_60);
    __gnu_cxx::__normal_iterator<Occupy_*,_std::vector<Occupy,_std::allocator<Occupy>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<ScheduleHandle> generateSubstitutions(const ScheduleHandle &schedule) {
        // Analyze schedule
        schedule->analyze();

        // Re-generate graph
        // printf(" @ Generating substitutions (count: %zu, peak: %s, time: %s) ...\n", schedule->occupies.size(),
        //        prettyBytes(schedule->peak_memory).c_str(), prettyNanoseconds(schedule->total_time).c_str());
        std::vector<ScheduleHandle> substitutions;
        for (auto &occupy: schedule->occupies) {
            // printf("   @ [%s, %s] occupies (score1=%.6lf, score2=%.6lf)\n", occupy.gen->name.c_str(),
            //        occupy.use->name.c_str(), occupy.score1, occupy.score2);
            // printf("   @ Moving: %d\n", occupy.move);
            // for (auto &usage: occupy.gen->ins) {
            //     printf("     @ In: %d\n", usage.operand->id);
            // }
            // for (auto &usage: occupy.gen->outs) {
            //     printf("     @ Out: %d\n", usage.operand->id);
            // }
            // for (auto &task: occupy.re_gen) {
            //     printf("     @ Re-gen: %s\n", task->name.c_str());
            // }
            auto new_schedule = schedule->apply(occupy);
            substitutions.push_back(new_schedule);
            new_schedule->analyze();
            // printf("   @ Optimized to (peak: %s, memory: %s, s1: %.3lf, s2: %.3lf)\n", prettyBytes(new_schedule->peak_memory).c_str(),
            //        prettyNanoseconds(new_schedule->total_time).c_str(), occupy.score1, occupy.score2);
        }
        return substitutions;
    }